

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_base.cpp
# Opt level: O1

int __thiscall zmq::session_base_t::write_zap_msg(session_base_t *this,msg_t *msg_)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  size_t in_RCX;
  void *in_RDX;
  EVP_PKEY_CTX *ctx;
  
  if ((this->_zap_pipe == (pipe_t *)0x0) ||
     (ctx = (EVP_PKEY_CTX *)msg_, sVar3 = pipe_t::write(this->_zap_pipe,(int)msg_,in_RDX,in_RCX),
     (char)sVar3 == '\0')) {
    piVar4 = __errno_location();
    *piVar4 = 0x6b;
    return -1;
  }
  bVar1 = msg_t::flags(msg_);
  if ((bVar1 & 1) == 0) {
    pipe_t::flush(this->_zap_pipe);
  }
  iVar2 = msg_t::init(msg_,ctx);
  if (iVar2 == 0) {
    return 0;
  }
  write_zap_msg();
  return 0;
}

Assistant:

int zmq::session_base_t::write_zap_msg (msg_t *msg_)
{
    if (_zap_pipe == NULL || !_zap_pipe->write (msg_)) {
        errno = ENOTCONN;
        return -1;
    }

    if ((msg_->flags () & msg_t::more) == 0)
        _zap_pipe->flush ();

    const int rc = msg_->init ();
    errno_assert (rc == 0);
    return 0;
}